

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall OneWireSimulationDataGenerator::SimResetPacket(OneWireSimulationDataGenerator *this)

{
  int iVar1;
  ulong uVar2;
  uint local_20;
  uint local_1c;
  U32 device_responce_length;
  U32 device_responce_delay;
  U32 reset_pulse_length;
  U32 reset_window_length;
  OneWireSimulationDataGenerator *this_local;
  
  device_responce_delay = 0x3c0;
  device_responce_length = 0x1e0;
  uVar2 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  if (0xf < (uVar2 >> 5) % 0x14) {
    device_responce_length = 0x1b8;
  }
  local_1c = 0x1e;
  local_20 = 0x78;
  if ((this->mSimOverdrive & 1U) == 1) {
    device_responce_delay = 0x60;
    device_responce_length = 0x30;
    local_1c = 4;
    local_20 = 0xc;
  }
  SimulationChannelDescriptor::Transition();
  iVar1 = (int)this;
  UsToSamples(this,(ulong)device_responce_length);
  SimulationChannelDescriptor::Advance(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  UsToSamples(this,(ulong)local_1c);
  SimulationChannelDescriptor::Advance(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  UsToSamples(this,(ulong)local_20);
  SimulationChannelDescriptor::Advance(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  UsToSamples(this,(ulong)(((device_responce_delay - device_responce_length) - local_1c) - local_20)
             );
  SimulationChannelDescriptor::Advance(iVar1 + 0x18);
  return;
}

Assistant:

void OneWireSimulationDataGenerator::SimResetPacket()
{
    U32 reset_window_length = 960;
    U32 reset_pulse_length = 480;
    if( ( ( mOneWireSimulationData.GetCurrentSampleNumber() >> 5 ) % 20 ) > 15 )
        reset_pulse_length = 440;
    U32 device_responce_delay = 30;
    U32 device_responce_length = 120;

    if( mSimOverdrive == true )
    {
        reset_window_length = 96;
        reset_pulse_length = 48;
        device_responce_delay = 4;
        device_responce_length = 12;
    }

    // mOneWireTransitions->push_back(mSimulationSampleIndex);
    mOneWireSimulationData.Transition();
    // mSimulationSampleIndex += UsToSamples(reset_pulse_length );		//Reset Pulse Length
    mOneWireSimulationData.Advance( U32( UsToSamples( reset_pulse_length ) ) );
    // mOneWireTransitions->push_back(mSimulationSampleIndex);
    mOneWireSimulationData.Transition();
    // mSimulationSampleIndex += UsToSamples(device_responce_delay );		//Typical delay before responce
    mOneWireSimulationData.Advance( U32( UsToSamples( device_responce_delay ) ) );
    // mOneWireTransitions->push_back(mSimulationSampleIndex);
    mOneWireSimulationData.Transition();
    // mSimulationSampleIndex += UsToSamples(device_responce_length );		//Typical responce length
    mOneWireSimulationData.Advance( U32( UsToSamples( device_responce_length ) ) );
    // mOneWireTransitions->push_back(mSimulationSampleIndex);
    mOneWireSimulationData.Transition();
    // mSimulationSampleIndex += UsToSamples( reset_window_length - reset_pulse_length - device_responce_delay - device_responce_length,
    // true );	//Required Time for Reset and Presence opperation.
    mOneWireSimulationData.Advance(
        U32( UsToSamples( reset_window_length - reset_pulse_length - device_responce_delay - device_responce_length ) ) );
}